

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_textedit_init_fixed(nk_text_edit *state,void *memory,nk_size size)

{
  void *in_RDX;
  nk_str *in_RSI;
  void *in_RDI;
  
  if (((in_RDI != (void *)0x0) && (in_RSI != (nk_str *)0x0)) && (in_RDX != (void *)0x0)) {
    nk_memset(in_RDI,0,0x1508);
    nk_textedit_clear_state
              ((nk_text_edit *)size,(nk_text_edit_type)((ulong)in_RDI >> 0x20),
               (nk_plugin_filter)in_RSI);
    nk_str_init_fixed(in_RSI,in_RDX,0x13c2e3);
  }
  return;
}

Assistant:

NK_API void
nk_textedit_init_fixed(struct nk_text_edit *state, void *memory, nk_size size)
{
NK_ASSERT(state);
NK_ASSERT(memory);
if (!state || !memory || !size) return;
NK_MEMSET(state, 0, sizeof(struct nk_text_edit));
nk_textedit_clear_state(state, NK_TEXT_EDIT_SINGLE_LINE, 0);
nk_str_init_fixed(&state->string, memory, size);
}